

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Stable_options>::insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Stable_options> *this,initializer_list<int> *Nsimplex,
          Filtration_value *filtration)

{
  int iVar1;
  Filtration_value FVar2;
  int *__first;
  long lVar3;
  int *piVar4;
  Filtration_value *filt;
  int iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  undefined8 *puVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar9;
  
  FVar2 = filtration[1];
  if (FVar2 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    __first = (int *)*filtration;
    if ((char)in_FS_OFFSET[-0x15] == '\0') {
      in_FS_OFFSET[-0x16] = 0;
      in_FS_OFFSET[-0x18] = 0;
      in_FS_OFFSET[-0x17] = 0;
      __cxa_thread_atexit(std::vector<int,_std::allocator<int>_>::~vector,*in_FS_OFFSET + -0xc0,
                          &__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -0x15) = 1;
    }
    lVar3 = *in_FS_OFFSET;
    piVar4 = (int *)in_FS_OFFSET[-0x18];
    __position._M_current = (int *)in_FS_OFFSET[-0x17];
    if ((int *)in_FS_OFFSET[-0x17] != piVar4) {
      in_FS_OFFSET[-0x17] = (long)piVar4;
      __position._M_current = piVar4;
    }
    std::vector<int,std::allocator<int>>::insert<int_const*,void>
              ((vector<int,std::allocator<int>> *)(lVar3 + -0xc0),__position,__first,
               __first + (long)FVar2);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (in_FS_OFFSET[-0x18],in_FS_OFFSET[-0x17]);
    _Var6 = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0x18],in_FS_OFFSET[-0x17]);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)(lVar3 + -0xc0),(const_iterator)_Var6._M_current
               ,(int *)in_FS_OFFSET[-0x17]);
    _Var6._M_current = (int *)in_FS_OFFSET[-0x18];
    filt = (Filtration_value *)in_FS_OFFSET[-0x17];
    _Var8._M_current = _Var6._M_current;
    while ((Filtration_value *)_Var8._M_current != filt) {
      iVar1 = *_Var8._M_current;
      _Var8._M_current = (int *)((long)_Var8._M_current + 4);
      if (iVar1 == (int)Nsimplex[3]._M_len) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
    }
    iVar5 = (int)((ulong)((long)filt - (long)_Var6._M_current) >> 2) + -1;
    iVar1 = (int)Nsimplex[8]._M_len;
    if (iVar5 < iVar1) {
      iVar5 = iVar1;
    }
    *(int *)&Nsimplex[8]._M_len = iVar5;
    pVar9 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (this,(Siblings *)Nsimplex,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (Nsimplex + 4),_Var6,filt);
    filtration = pVar9._8_8_;
  }
  pVar9._8_8_ = filtration;
  pVar9.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar9;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }